

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O0

void Vertical_Sweep_Drop(black_PWorker worker,Short y,FT_F26Dot6 x1,FT_F26Dot6 x2,
                        PProfile_conflict left,PProfile_conflict right)

{
  ulong uVar1;
  ushort uVar2;
  short sVar3;
  ulong uVar4;
  long lVar5;
  ulong local_78;
  Int dropOutControl;
  Short f1;
  Short c1;
  Long pxl;
  Long e2;
  Long e1;
  PProfile_conflict right_local;
  PProfile_conflict left_local;
  FT_F26Dot6 x2_local;
  FT_F26Dot6 x1_local;
  Short y_local;
  black_PWorker worker_local;
  
  local_78 = (x1 + worker->precision) - 1U & (long)-worker->precision;
  uVar4 = x2 & -worker->precision;
  _dropOutControl = local_78;
  if ((long)uVar4 < (long)local_78) {
    uVar2 = left->flags & 7;
    if (local_78 != uVar4 + (long)worker->precision) {
      return;
    }
    _dropOutControl = uVar4;
    switch(uVar2) {
    case 0:
      break;
    case 1:
    case 5:
      if ((left->next == right) && (left->height < 1)) {
        if ((left->flags & 0x10) == 0) {
          return;
        }
        if (x2 - x1 < (long)worker->precision_half) {
          return;
        }
      }
      if ((right->next == left) && (left->start == (long)y)) {
        if ((left->flags & 0x20) == 0) {
          return;
        }
        if (x2 - x1 < (long)worker->precision_half) {
          return;
        }
      }
      if (uVar2 != 1) {
        _dropOutControl =
             x1 + x2 + (long)((worker->precision * 0x3f) / 0x40) >> 1 & (long)-worker->precision;
      }
      break;
    default:
      return;
    case 4:
      _dropOutControl =
           x1 + x2 + (long)((worker->precision * 0x3f) / 0x40) >> 1 & (long)-worker->precision;
    }
    uVar1 = local_78;
    if ((-1 < (long)_dropOutControl) &&
       (uVar1 = _dropOutControl,
       (long)(ulong)worker->bWidth <= (long)_dropOutControl >> ((byte)worker->precision_bits & 0x3f)
       )) {
      uVar1 = uVar4;
    }
    _dropOutControl = uVar1;
    if (_dropOutControl == local_78) {
      local_78 = uVar4;
    }
    lVar5 = (long)local_78 >> ((byte)worker->precision_bits & 0x3f);
    if (((-1 < lVar5) && (lVar5 < (long)(ulong)worker->bWidth)) &&
       (((uint)worker->bLine[(short)(lVar5 >> 3)] & 0x80 >> ((byte)lVar5 & 7)) != 0)) {
      return;
    }
  }
  lVar5 = (long)_dropOutControl >> ((byte)worker->precision_bits & 0x3f);
  if ((-1 < lVar5) && (lVar5 < (long)(ulong)worker->bWidth)) {
    sVar3 = (short)(lVar5 >> 3);
    worker->bLine[sVar3] = worker->bLine[sVar3] | (byte)(0x80 >> ((byte)lVar5 & 7));
  }
  return;
}

Assistant:

static void
  Vertical_Sweep_Drop( RAS_ARGS Short       y,
                                FT_F26Dot6  x1,
                                FT_F26Dot6  x2,
                                PProfile    left,
                                PProfile    right )
  {
    Long   e1, e2, pxl;
    Short  c1, f1;


    FT_TRACE7(( "  y=%d x=[% .12f;% .12f]",
                y,
                (double)x1 / (double)ras.precision,
                (double)x2 / (double)ras.precision ));

    /* Drop-out control */

    /*   e2            x2                    x1           e1   */
    /*                                                         */
    /*                 ^                     |                 */
    /*                 |                     |                 */
    /*   +-------------+---------------------+------------+    */
    /*                 |                     |                 */
    /*                 |                     v                 */
    /*                                                         */
    /* pixel         contour              contour       pixel  */
    /* center                                           center */

    /* drop-out mode    scan conversion rules (as defined in OpenType) */
    /* --------------------------------------------------------------- */
    /*  0                1, 2, 3                                       */
    /*  1                1, 2, 4                                       */
    /*  2                1, 2                                          */
    /*  3                same as mode 2                                */
    /*  4                1, 2, 5                                       */
    /*  5                1, 2, 6                                       */
    /*  6, 7             same as mode 2                                */

    e1  = CEILING( x1 );
    e2  = FLOOR  ( x2 );
    pxl = e1;

    if ( e1 > e2 )
    {
      Int  dropOutControl = left->flags & 7;


      if ( e1 == e2 + ras.precision )
      {
        switch ( dropOutControl )
        {
        case 0: /* simple drop-outs including stubs */
          pxl = e2;
          break;

        case 4: /* smart drop-outs including stubs */
          pxl = SMART( x1, x2 );
          break;

        case 1: /* simple drop-outs excluding stubs */
        case 5: /* smart drop-outs excluding stubs  */

          /* Drop-out Control Rules #4 and #6 */

          /* The specification neither provides an exact definition */
          /* of a `stub' nor gives exact rules to exclude them.     */
          /*                                                        */
          /* Here the constraints we use to recognize a stub.       */
          /*                                                        */
          /*  upper stub:                                           */
          /*                                                        */
          /*   - P_Left and P_Right are in the same contour         */
          /*   - P_Right is the successor of P_Left in that contour */
          /*   - y is the top of P_Left and P_Right                 */
          /*                                                        */
          /*  lower stub:                                           */
          /*                                                        */
          /*   - P_Left and P_Right are in the same contour         */
          /*   - P_Left is the successor of P_Right in that contour */
          /*   - y is the bottom of P_Left                          */
          /*                                                        */
          /* We draw a stub if the following constraints are met.   */
          /*                                                        */
          /*   - for an upper or lower stub, there is top or bottom */
          /*     overshoot, respectively                            */
          /*   - the covered interval is greater or equal to a half */
          /*     pixel                                              */

          /* upper stub test */
          if ( left->next == right                &&
               left->height <= 0                  &&
               !( left->flags & Overshoot_Top   &&
                  x2 - x1 >= ras.precision_half ) )
            goto Exit;

          /* lower stub test */
          if ( right->next == left                 &&
               left->start == y                    &&
               !( left->flags & Overshoot_Bottom &&
                  x2 - x1 >= ras.precision_half  ) )
            goto Exit;

          if ( dropOutControl == 1 )
            pxl = e2;
          else
            pxl = SMART( x1, x2 );
          break;

        default: /* modes 2, 3, 6, 7 */
          goto Exit;  /* no drop-out control */
        }

        /* undocumented but confirmed: If the drop-out would result in a  */
        /* pixel outside of the bounding box, use the pixel inside of the */
        /* bounding box instead                                           */
        if ( pxl < 0 )
          pxl = e1;
        else if ( TRUNC( pxl ) >= ras.bWidth )
          pxl = e2;

        /* check that the other pixel isn't set */
        e1 = ( pxl == e1 ) ? e2 : e1;

        e1 = TRUNC( e1 );

        c1 = (Short)( e1 >> 3 );
        f1 = (Short)( e1 &  7 );

        if ( e1 >= 0 && e1 < ras.bWidth     &&
             ras.bLine[c1] & ( 0x80 >> f1 ) )
          goto Exit;
      }
      else
        goto Exit;
    }

    e1 = TRUNC( pxl );

    if ( e1 >= 0 && e1 < ras.bWidth )
    {
      FT_TRACE7(( " -> x=%ld", e1 ));

      c1 = (Short)( e1 >> 3 );
      f1 = (Short)( e1 & 7 );

      ras.bLine[c1] |= (char)( 0x80 >> f1 );
    }

  Exit:
    FT_TRACE7(( " dropout=%d\n", left->flags & 7 ));
  }